

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O2

void aom_highbd_quantize_b_32x32_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  longlong *plVar1;
  short sVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  __m256i qcoeff;
  __m256i qcoeff_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  int i;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  __m256i *qcoeff1;
  __m256i *qcoeff0;
  long lVar14;
  undefined8 uVar15;
  longlong lVar16;
  undefined1 auVar17 [16];
  longlong lVar20;
  longlong lVar21;
  undefined1 auVar18 [32];
  __m256i alVar19;
  longlong lVar22;
  undefined4 uVar23;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined1 auVar25 [16];
  undefined4 uVar31;
  undefined1 auVar28 [32];
  undefined1 in_ZMM3 [64];
  __m128i mask;
  __m128i mask_00;
  __m256i shift;
  __m256i mask0;
  __m256i quant;
  undefined8 in_stack_fffffffffffffd00;
  int iVar32;
  int iVar33;
  uint in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  __m256i alVar34;
  longlong local_2c0;
  longlong lStack_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  longlong lStack_288;
  undefined1 local_280 [32];
  __m256i local_260;
  __m256i local_240;
  intptr_t local_208;
  __m256i local_200;
  __m256i local_1e0;
  undefined1 local_1c0 [32];
  __m256i local_1a0;
  longlong local_180;
  longlong lStack_178;
  longlong lStack_170;
  longlong lStack_168;
  __m256i local_160;
  __m256i local_140;
  __m256i local_120;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  __m256i local_a0 [3];
  undefined8 uVar24;
  undefined1 auVar26 [24];
  undefined1 auVar27 [32];
  
  iVar33 = 0;
  iVar32 = 1;
  local_180 = 0;
  lStack_178 = 0;
  lStack_170 = 0;
  lStack_168 = 0;
  auVar25._8_2_ = 1;
  auVar25._0_8_ = 0x1000100010001;
  auVar25._10_2_ = 1;
  auVar25._12_2_ = 1;
  auVar25._14_2_ = 1;
  auVar25 = vpand_avx(ZEXT416(*(uint *)zbin_ptr),auVar25);
  auVar17 = vpsraw_avx(ZEXT416(*(uint *)zbin_ptr),1);
  auVar25 = vpaddw_avx(auVar25,auVar17);
  auVar25 = vpmovsxwd_avx(auVar25);
  uVar15 = auVar25._0_8_;
  for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
    *(int *)(&stack0xfffffffffffffd18 + lVar11 * 4) =
         (dequant_ptr[lVar11] * 0x145 + 0x40 >> 7) +
         *(int *)(&stack0xfffffffffffffd10 + lVar11 * 4) * 0x20 + -1;
  }
  uVar29 = in_stack_fffffffffffffd1c;
  uVar23 = in_stack_fffffffffffffd1c;
  uVar24 = CONCAT44(uVar29,uVar23);
  uVar30 = in_stack_fffffffffffffd1c;
  auVar26._8_4_ = uVar30;
  auVar26._0_8_ = uVar24;
  uVar31 = in_stack_fffffffffffffd1c;
  auVar26._12_4_ = uVar31;
  auVar26._16_4_ = in_stack_fffffffffffffd1c;
  auVar26._20_4_ = in_stack_fffffffffffffd1c;
  auVar27._24_4_ = in_stack_fffffffffffffd1c;
  auVar27._0_24_ = auVar26;
  auVar27._28_4_ = in_stack_fffffffffffffd1c;
  local_a0[0] = (__m256i)vblendps_avx(auVar27,ZEXT432(in_stack_fffffffffffffd18),1);
  auVar4 = vpmovsxwd_avx2(*(undefined1 (*) [16])zbin_ptr);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])round_ptr);
  local_200 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])quant_ptr);
  auVar5 = vpmovsxwd_avx2(*(undefined1 (*) [16])dequant_ptr);
  alVar34 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])quant_shift_ptr);
  auVar28 = vpcmpeqd_avx2((undefined1  [32])alVar34,(undefined1  [32])alVar34);
  auVar4 = vpsubd_avx2(auVar4,auVar28);
  auVar28 = vpsubd_avx2(auVar18,auVar28);
  auVar18 = vpsrld_avx2(auVar4,1);
  local_1a0 = (__m256i)vpsrld_avx2(auVar28,1);
  local_c0 = *(undefined1 (*) [32])coeff_ptr;
  local_240 = (__m256i)vpabsd_avx2(local_c0);
  qcoeff0 = &local_240;
  local_e0 = *(undefined1 (*) [32])(coeff_ptr + 8);
  local_260 = (__m256i)vpabsd_avx2(local_e0);
  qcoeff1 = &local_260;
  auVar28 = ZEXT1632(in_ZMM3._0_16_);
  local_208 = n_coeffs;
  local_1e0 = alVar34;
  local_1c0 = (undefined1  [32])local_260;
  local_160 = local_200;
  local_140 = local_240;
  local_120 = local_1a0;
  highbd_update_mask0_avx2
            (qcoeff0,qcoeff1,local_a0,iscan,(int *)&stack0xfffffffffffffd0c,(__m256i *)&local_180);
  auVar8 = local_1c0;
  auVar4 = vpcmpgtd_avx2(auVar18,(undefined1  [32])local_140);
  auVar28 = vpcmpeqd_avx2(auVar28,auVar28);
  auVar18 = vpermq_avx2(auVar18,0xee);
  local_140 = (__m256i)vpaddd_avx2(auVar18,auVar28);
  auVar18 = vpcmpgtd_avx2(local_1c0,(undefined1  [32])local_140);
  auVar28 = vpackssdw_avx2(auVar4 ^ auVar28,auVar18);
  uVar9 = (uint)(SUB321(auVar28 >> 7,0) & 1) | (uint)(SUB321(auVar28 >> 0xf,0) & 1) << 1 |
          (uint)(SUB321(auVar28 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar28 >> 0x1f,0) & 1) << 3 |
          (uint)(SUB321(auVar28 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar28 >> 0x2f,0) & 1) << 5 |
          (uint)(SUB321(auVar28 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar28 >> 0x3f,0) & 1) << 7 |
          (uint)(SUB321(auVar28 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar28 >> 0x4f,0) & 1) << 9 |
          (uint)(SUB321(auVar28 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar28 >> 0x5f,0) & 1) << 0xb
          | (uint)(SUB321(auVar28 >> 0x67,0) & 1) << 0xc |
          (uint)(SUB321(auVar28 >> 0x6f,0) & 1) << 0xd |
          (uint)(SUB321(auVar28 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar28 >> 0x7f,0) << 0xf |
          (uint)(SUB321(auVar28 >> 0x87,0) & 1) << 0x10 |
          (uint)(SUB321(auVar28 >> 0x8f,0) & 1) << 0x11 |
          (uint)(SUB321(auVar28 >> 0x97,0) & 1) << 0x12 |
          (uint)(SUB321(auVar28 >> 0x9f,0) & 1) << 0x13 |
          (uint)(SUB321(auVar28 >> 0xa7,0) & 1) << 0x14 |
          (uint)(SUB321(auVar28 >> 0xaf,0) & 1) << 0x15 |
          (uint)(SUB321(auVar28 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar28 >> 0xbf,0) << 0x17 |
          (uint)(SUB321(auVar28 >> 199,0) & 1) << 0x18 |
          (uint)(SUB321(auVar28 >> 0xcf,0) & 1) << 0x19 |
          (uint)(SUB321(auVar28 >> 0xd7,0) & 1) << 0x1a |
          (uint)(SUB321(auVar28 >> 0xdf,0) & 1) << 0x1b |
          (uint)(SUB321(auVar28 >> 0xe7,0) & 1) << 0x1c |
          (uint)(SUB321(auVar28 >> 0xef,0) & 1) << 0x1d |
          (uint)(SUB321(auVar28 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar28[0x1f] >> 7) << 0x1f;
  local_1c0._1_3_ = (int3)(uVar9 >> 8);
  local_1c0[0] = uVar9 == 0;
  local_1c0._4_28_ = auVar8._4_28_;
  lStack_288 = auVar27._24_8_;
  if (uVar9 == 0) {
    local_a0[0][3] = lStack_288;
    local_a0[0][0] = uVar24;
    local_a0[0][1] = auVar26._8_8_;
    local_a0[0][2] = auVar26._16_8_;
    lVar16 = 0;
    lVar20 = 0;
    lVar21 = 0;
    lVar22 = 0;
    qcoeff_ptr[8] = 0;
    qcoeff_ptr[9] = 0;
    qcoeff_ptr[10] = 0;
    qcoeff_ptr[0xb] = 0;
    qcoeff_ptr[0xc] = 0;
    qcoeff_ptr[0xd] = 0;
    qcoeff_ptr[0xe] = 0;
    qcoeff_ptr[0xf] = 0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    dqcoeff_ptr[4] = 0;
    dqcoeff_ptr[5] = 0;
    dqcoeff_ptr[6] = 0;
    dqcoeff_ptr[7] = 0;
    local_120 = (__m256i)vpermpd_avx2((undefined1  [32])local_1a0,0xee);
    local_160 = (__m256i)vpermpd_avx2((undefined1  [32])local_200,0xee);
    local_1e0 = (__m256i)vpermpd_avx2((undefined1  [32])alVar34,0xee);
    vpermq_avx2(auVar5,0xee);
    local_280 = ZEXT1632(ZEXT816(0));
  }
  else {
    auVar28 = vpermq_avx2(auVar28,0xd8);
    auVar28 = vpand_avx2(auVar28,*(undefined1 (*) [32])iscan);
    local_280 = vpmaxsw_avx2(auVar28,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    local_a0[0][3] = lStack_288;
    local_a0[0][0] = uVar24;
    local_a0[0][1] = auVar26._8_8_;
    local_a0[0][2] = auVar26._16_8_;
    qcoeff1 = &local_120;
    local_100 = auVar18;
    highbd_calculate_qcoeff_avx2
              (&local_240,qcoeff1,&local_160,&local_1e0,(int *)&stack0xfffffffffffffd08);
    local_120 = (__m256i)vpermpd_avx2((undefined1  [32])local_1a0,0xee);
    local_160 = (__m256i)vpermpd_avx2((undefined1  [32])local_200,0xee);
    local_1e0 = (__m256i)vpermpd_avx2((undefined1  [32])alVar34,0xee);
    qcoeff0 = &local_260;
    highbd_calculate_qcoeff_avx2
              (qcoeff0,qcoeff1,&local_160,&local_1e0,(int *)&stack0xfffffffffffffd08);
    local_240 = (__m256i)vpsignd_avx2((undefined1  [32])local_240,local_c0);
    auVar28 = vpsignd_avx2((undefined1  [32])local_260,local_e0);
    alVar19 = (__m256i)vpandn_avx2(auVar4,(undefined1  [32])local_240);
    local_200 = (__m256i)vpand_avx2(auVar28,local_100);
    *(__m256i *)qcoeff_ptr = alVar19;
    *(__m256i *)(qcoeff_ptr + 8) = local_200;
    alVar3[1]._0_4_ = iVar32;
    alVar3[0] = in_stack_fffffffffffffd00;
    alVar3[1]._4_4_ = iVar33;
    alVar3[2] = uVar15;
    alVar3[3]._0_4_ = in_stack_fffffffffffffd18;
    alVar3[3]._4_4_ = in_stack_fffffffffffffd1c;
    highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0,alVar3,alVar34,(int)qcoeff1);
    vpermpd_avx2(auVar5,0xee);
    alVar34[1]._0_4_ = iVar32;
    alVar34[0] = in_stack_fffffffffffffd00;
    alVar34[1]._4_4_ = iVar33;
    alVar34[2] = uVar15;
    alVar34[3]._0_4_ = in_stack_fffffffffffffd18;
    alVar34[3]._4_4_ = in_stack_fffffffffffffd1c;
    lVar16 = local_200[0];
    lVar20 = local_200[1];
    lVar21 = local_200[2];
    lVar22 = local_200[3];
    highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0,alVar34,alVar19,(int)qcoeff1);
    *(longlong *)dqcoeff_ptr = alVar19[0];
    *(longlong *)(dqcoeff_ptr + 2) = alVar19[1];
    *(longlong *)(dqcoeff_ptr + 4) = alVar19[2];
    *(longlong *)(dqcoeff_ptr + 6) = alVar19[3];
  }
  *(longlong *)(dqcoeff_ptr + 8) = lVar16;
  *(longlong *)(dqcoeff_ptr + 10) = lVar20;
  *(longlong *)(dqcoeff_ptr + 0xc) = lVar21;
  *(longlong *)(dqcoeff_ptr + 0xe) = lVar22;
  lVar11 = 0x10;
LAB_00318678:
  lVar14 = (long)(int)lVar11 * 2;
  lVar6 = (long)(int)lVar11;
  while (lVar11 = lVar6 + 0x10, lVar6 < local_208) {
    local_200 = *(__m256i *)(coeff_ptr + lVar6);
    alVar34 = (__m256i)vpabsd_avx2((undefined1  [32])local_200);
    local_1a0 = *(__m256i *)(coeff_ptr + lVar6 + 8);
    alVar19 = (__m256i)vpabsd_avx2((undefined1  [32])local_1a0);
    qcoeff0 = &local_240;
    qcoeff1 = &local_260;
    local_260 = alVar19;
    local_240 = alVar34;
    highbd_update_mask0_avx2
              (qcoeff0,qcoeff1,local_a0,(int16_t *)((long)iscan + lVar14),
               (int *)&stack0xfffffffffffffd0c,(__m256i *)&local_180);
    alVar34 = (__m256i)vpcmpgtd_avx2((undefined1  [32])alVar34,(undefined1  [32])local_140);
    auVar4 = vpcmpgtd_avx2((undefined1  [32])alVar19,(undefined1  [32])local_140);
    auVar28 = vpackssdw_avx2((undefined1  [32])alVar34,auVar4);
    if ((((((((((((((((((((((((((((((((auVar28 >> 7 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar28 >> 0xf & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar28 >> 0x17 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar28 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar28 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar28 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar28 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar28 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar28 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar28 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar28 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar28 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar28 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar28 >> 0x7f,0) != '\0') ||
                      (auVar28 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar28 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar28 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar28 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar28 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar28 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0xbf,0) != '\0') ||
              (auVar28 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar28 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar28 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar28 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar28 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         (auVar28 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
        (auVar28 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0')
    goto LAB_0031877f;
    auVar28 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    local_280 = vpmaxsw_avx2(local_280,auVar28);
    *(undefined1 (*) [32])(qcoeff_ptr + lVar6 + 8) = auVar28;
    *(undefined1 (*) [32])(qcoeff_ptr + lVar6) = auVar28;
    *(undefined1 (*) [32])(dqcoeff_ptr + lVar6 + 8) = auVar28;
    *(undefined1 (*) [32])(dqcoeff_ptr + lVar6) = auVar28;
    lVar14 = lVar14 + 0x20;
    lVar6 = lVar11;
  }
  if (iVar33 == 0) {
    uVar9 = 0;
  }
  else {
    auVar17._8_8_ = lStack_178;
    auVar17._0_8_ = local_180;
    auVar7._8_8_ = lStack_168;
    auVar7._0_8_ = lStack_170;
    vpmaxsw_avx(auVar17,auVar7);
    mask[1] = (longlong)qcoeff1;
    mask[0] = (longlong)qcoeff0;
    uVar9 = calculate_non_zero_count(mask);
  }
  if ((local_1c0 & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
    vpmaxsw_avx(local_280._0_16_,local_280._16_16_);
    mask_00[1] = (longlong)qcoeff1;
    mask_00[0] = (longlong)qcoeff0;
    iVar32 = calculate_non_zero_count(mask_00);
    uVar10 = iVar32 - 1;
  }
  else {
    uVar10 = 0xffffffff;
  }
  for (; (int)uVar9 <= (int)uVar10; uVar10 = uVar10 - 1) {
    sVar2 = scan[uVar10];
    qcoeff_ptr[sVar2] = 0;
    dqcoeff_ptr[sVar2] = 0;
  }
  uVar10 = uVar9 + 1;
  uVar13 = (ulong)uVar9;
  do {
    if ((long)uVar13 < 1) {
      uVar10 = 0;
      break;
    }
    lVar11 = uVar13 - 1;
    uVar13 = uVar13 - 1;
    uVar10 = uVar10 - 1;
  } while (qcoeff_ptr[scan[lVar11]] == 0);
  *eob_ptr = (uint16_t)uVar10;
  uVar13 = 0;
  uVar12 = 0xffffffff;
  do {
    if (uVar9 == uVar13) {
LAB_00318967:
      if (((uint16_t)uVar10 != 0) && (uVar12 == (uVar10 & 0xffff) - 1)) {
        sVar2 = scan[uVar12];
        if (((qcoeff_ptr[sVar2] == 1) || (qcoeff_ptr[sVar2] == -1)) &&
           (uVar9 = coeff_ptr[sVar2] >> 0x1f,
           (int)((coeff_ptr[sVar2] << 5 ^ uVar9) - uVar9) <
           *(int *)(&stack0xfffffffffffffd10 + (ulong)(sVar2 != 0) * 4) * 0x20 +
           (dequant_ptr[sVar2 != 0] * 0x20d + 0x40 >> 7))) {
          qcoeff_ptr[sVar2] = 0;
          dqcoeff_ptr[sVar2] = 0;
          *eob_ptr = 0;
        }
      }
      return;
    }
    if (qcoeff_ptr[scan[uVar13]] != 0) {
      uVar12 = (uint)uVar13;
      goto LAB_00318967;
    }
    uVar13 = uVar13 + 1;
  } while( true );
LAB_0031877f:
  auVar28 = vpermq_avx2(auVar28,0xd8);
  auVar28 = vpand_avx2(auVar28,*(undefined1 (*) [32])(iscan + lVar6));
  local_280 = vpmaxsw_avx2(auVar28,local_280);
  qcoeff1 = &local_120;
  highbd_calculate_qcoeff_avx2
            (&local_240,qcoeff1,&local_160,&local_1e0,(int *)&stack0xfffffffffffffd08);
  qcoeff0 = &local_260;
  highbd_calculate_qcoeff_avx2
            (qcoeff0,qcoeff1,&local_160,&local_1e0,(int *)&stack0xfffffffffffffd08);
  auVar28 = vpsignd_avx2((undefined1  [32])local_240,(undefined1  [32])local_200);
  auVar18 = vpsignd_avx2((undefined1  [32])local_260,(undefined1  [32])local_1a0);
  alVar19 = (__m256i)vpand_avx2(auVar28,(undefined1  [32])alVar34);
  alVar3 = (__m256i)vpand_avx2(auVar18,auVar4);
  *(__m256i *)(qcoeff_ptr + lVar6) = alVar19;
  *(__m256i *)(qcoeff_ptr + lVar6 + 8) = alVar3;
  qcoeff[1]._0_4_ = iVar32;
  qcoeff[0] = in_stack_fffffffffffffd00;
  qcoeff[1]._4_4_ = iVar33;
  qcoeff[2] = uVar15;
  qcoeff[3]._0_4_ = in_stack_fffffffffffffd18;
  qcoeff[3]._4_4_ = in_stack_fffffffffffffd1c;
  local_260 = alVar3;
  local_240 = alVar19;
  highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0,qcoeff,alVar34,(int)qcoeff1);
  local_2c0 = alVar3[0];
  lStack_2b8 = alVar3[1];
  lStack_2b0 = alVar3[2];
  lStack_2a8 = alVar3[3];
  qcoeff_00[1]._0_4_ = iVar32;
  qcoeff_00[0] = in_stack_fffffffffffffd00;
  qcoeff_00[1]._4_4_ = iVar33;
  qcoeff_00[2] = uVar15;
  qcoeff_00[3]._0_4_ = in_stack_fffffffffffffd18;
  qcoeff_00[3]._4_4_ = in_stack_fffffffffffffd1c;
  highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0,qcoeff_00,alVar19,(int)qcoeff1);
  plVar1 = (longlong *)(dqcoeff_ptr + lVar6);
  *plVar1 = alVar19[0];
  plVar1[1] = alVar19[1];
  plVar1[2] = alVar19[2];
  plVar1[3] = alVar19[3];
  plVar1 = (longlong *)(dqcoeff_ptr + lVar6 + 8);
  *plVar1 = local_2c0;
  plVar1[1] = lStack_2b8;
  plVar1[2] = lStack_2b0;
  plVar1[3] = lStack_2a8;
  auVar28._28_4_ = 0;
  auVar28._0_28_ = local_1c0._4_28_;
  local_1c0 = auVar28 << 0x20;
  goto LAB_00318678;
}

Assistant:

void aom_highbd_quantize_b_32x32_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const int log_scale = 1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff0, qcoeff0, coeff1, qcoeff1;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  const __m256i one = _mm256_set1_epi32(1);
  const __m256i log_scale_vec = _mm256_set1_epi32(log_scale);
  int prescan_add[2];
  int thresh[2];
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  zbin = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)zbin_ptr));
  round = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)round_ptr));
  quant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_ptr));
  dequant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)dequant_ptr));
  shift =
      _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_shift_ptr));

  // Shift with rounding.
  zbin = _mm256_add_epi32(zbin, log_scale_vec);
  round = _mm256_add_epi32(round, log_scale_vec);
  zbin = _mm256_srli_epi32(zbin, log_scale);
  round = _mm256_srli_epi32(round, log_scale);
  zbin = _mm256_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr));
  qcoeff0 = _mm256_abs_epi32(coeff0);
  coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + 8));
  qcoeff1 = _mm256_abs_epi32(coeff1);
  highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0,
                           &mask0);
  __m256i temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm256_permute2x128_si256(zbin, zbin, 0x11);
  __m256i temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_permute2x128_si256(round, round, 0x11);
    quant = _mm256_permute2x128_si256(quant, quant, 0x11);
    shift = _mm256_permute2x128_si256(shift, shift, 0x11);
    dequant = _mm256_permute2x128_si256(dequant, dequant, 0x11);
  } else {
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    round = _mm256_permute2x128_si256(round, round, 0x11);
    quant = _mm256_permute2x128_si256(quant, quant, 0x11);
    shift = _mm256_permute2x128_si256(shift, shift, 0x11);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    // Reinsert signs
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    // Mask out zbin threshold coeffs
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr);
    coeff0 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0, dequant, log_scale);
    dequant = _mm256_permute2x128_si256(dequant, dequant, 0x11);
    coeff1 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff1, dequant, log_scale);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr + index));
    qcoeff0 = _mm256_abs_epi32(coeff0);
    coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + index + 8));
    qcoeff1 = _mm256_abs_epi32(coeff1);
    highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan + index,
                             &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
    temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
    highbd_update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr + index);
    coeff0 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0, dequant, log_scale);
    coeff1 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff1, dequant, log_scale);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}